

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O0

void __thiscall lzham::lzcompressor::lzcompressor(lzcompressor *this)

{
  ulong in_RDI;
  state *in_stack_00000120;
  uint in_stack_00000164;
  char *in_stack_00000168;
  char *in_stack_00000170;
  char *in_stack_ffffffffffffff68;
  long in_stack_ffffffffffffff70;
  long in_stack_ffffffffffffff78;
  semaphore *in_stack_ffffffffffffff80;
  symbol_codec *in_stack_ffffffffffffff90;
  undefined8 local_58;
  search_accelerator *in_stack_ffffffffffffffb0;
  
  init_params::init_params((init_params *)(in_RDI + 0x1790));
  *(undefined8 *)(in_RDI + 0x17c8) = 0xffffffffffffffff;
  *(undefined4 *)(in_RDI + 0x17d0) = 0;
  search_accelerator::search_accelerator(in_stack_ffffffffffffffb0);
  symbol_codec::symbol_codec(in_stack_ffffffffffffff90);
  coding_stats::coding_stats((coding_stats *)0x1144dc);
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x3850));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x3860));
  *(undefined4 *)(in_RDI + 0x3870) = 0;
  *(undefined4 *)(in_RDI + 0x3874) = 0;
  *(undefined4 *)(in_RDI + 0x3878) = 0;
  *(undefined1 *)(in_RDI + 0x387c) = 0;
  state::state(in_stack_00000120);
  state::state(in_stack_00000120);
  *(undefined4 *)(in_RDI + 0xcbb0) = 0;
  local_58 = in_RDI + 0xcbb8;
  do {
    parse_thread_state::parse_thread_state((parse_thread_state *)0x1145a0);
    local_58 = local_58 + 0xb2b00;
  } while (local_58 != in_RDI + 0x5a23b8);
  *(undefined8 *)(in_RDI + 0x5a23b8) = 0;
  semaphore::semaphore
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
             in_stack_ffffffffffffff68);
  if ((in_RDI & 7) != 0) {
    lzham_assert(in_stack_00000170,in_stack_00000168,in_stack_00000164);
  }
  return;
}

Assistant:

lzcompressor::lzcompressor() :
      m_src_size(-1),
      m_src_adler32(0),
      m_step(0),
      m_block_start_dict_ofs(0),
      m_block_index(0),
      m_finished(false),
      m_num_parse_threads(0),
      m_parse_jobs_remaining(0)
   {
      LZHAM_VERIFY( ((uint32_ptr)this & (LZHAM_GET_ALIGNMENT(lzcompressor) - 1)) == 0);
   }